

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_init_ops_test(void)

{
  int iVar1;
  btree_kv_ops *pbVar2;
  btree_kv_ops *__s2;
  timeval __test_begin;
  char acStack_b0 [16];
  char acStack_a0 [16];
  timeval tStack_90;
  btree bStack_80;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar2 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  if (pbVar2 != (btree_kv_ops *)0x0) {
    __s2 = btree_str_kv_get_kb64_vb64(pbVar2);
    if (__s2 != (btree_kv_ops *)0x0) {
      iVar1 = bcmp(pbVar2,__s2,0x78);
      if (iVar1 != 0) {
        kv_init_ops_test();
      }
    }
    kv_init_ops_test();
    return;
  }
  kv_init_ops_test();
  gettimeofday(&tStack_90,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar2 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  (*pbVar2->init_kv_var)(&bStack_80,(void *)0x0,(void *)0x0);
  bStack_80.vsize = '\b';
  (*pbVar2->init_kv_var)(&bStack_80,acStack_a0,acStack_b0);
  if (acStack_a0[0] != '\0') {
    kv_init_var_test();
  }
  if (acStack_b0[0] != '\0') {
    kv_init_var_test();
  }
  kv_init_var_test();
  return;
}

Assistant:

void kv_init_ops_test()
{
    TEST_INIT();
    memleak_start();

    // init with null
    btree_kv_ops *kv_ops = btree_str_kv_get_kb64_vb64(NULL);
    TEST_CHK(kv_ops != NULL);

    // re-init with existing ops
    btree_kv_ops *kv_ops_copy =  btree_str_kv_get_kb64_vb64(kv_ops);
    if (kv_ops && kv_ops_copy) {
        TEST_CHK(memcmp(kv_ops, kv_ops_copy, sizeof(btree_kv_ops)) == 0);
    }

    free(kv_ops);
    memleak_end();
    TEST_RESULT("kv init ops test");
}